

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceULT.cpp
# Opt level: O3

void __thiscall
CTestResource_Test2DLinearResource_Test::TestBody(CTestResource_Test2DLinearResource_Test *this)

{
  GMM_RESOURCE_INFO *pGVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  undefined4 local_b0;
  undefined4 local_ac;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_38 = 0;
  local_b0 = 2;
  local_48 = 0x100000000;
  local_a0 = 0x80000;
  local_a8 = 0x400000000;
  lVar4 = 0;
  do {
    local_ac = *(undefined4 *)((long)&DAT_001a85f0 + lVar4);
    uStack_80 = 1;
    local_78 = CONCAT44(local_78._4_4_,1);
    pGVar1 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&local_b0);
    uVar2 = (int)local_78 + 3;
    uVar3 = ((int)uStack_80 + 0xfU & 0xfffffff0) * *(int *)((long)&DAT_001a8580 + lVar4);
    if (uVar3 < 0x21) {
      uVar3 = 0x20;
    }
    uVar3 = uVar3 + 0x3f & 0xffffffc0;
    CTestResource::VerifyResourceHAlign<true>(&this->super_CTestResource,pGVar1,0x10);
    CTestResource::VerifyResourceVAlign<true>(&this->super_CTestResource,pGVar1,4);
    CTestResource::VerifyResourcePitch<true>(&this->super_CTestResource,pGVar1,uVar3);
    CTestResource::VerifyResourceSize<true>
              (&this->super_CTestResource,pGVar1,
               (ulong)((uVar2 & 0xfffffffc) * uVar3 + 0xfff & 0xfffff000));
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar1);
    lVar4 = lVar4 + 4;
  } while ((int)lVar4 != 0x14);
  lVar4 = 0;
  do {
    local_ac = *(undefined4 *)((long)&DAT_001a85f0 + lVar4);
    uStack_80 = 0x100;
    local_78 = CONCAT44(local_78._4_4_,0x100);
    pGVar1 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&local_b0);
    uVar2 = (int)local_78 + 3;
    uVar3 = ((int)uStack_80 + 0xfU & 0xfffffff0) * *(int *)((long)&DAT_001a8580 + lVar4);
    if (uVar3 < 0x21) {
      uVar3 = 0x20;
    }
    uVar3 = uVar3 + 0x3f & 0xffffffc0;
    CTestResource::VerifyResourceHAlign<true>(&this->super_CTestResource,pGVar1,0x10);
    CTestResource::VerifyResourceVAlign<true>(&this->super_CTestResource,pGVar1,4);
    CTestResource::VerifyResourcePitch<true>(&this->super_CTestResource,pGVar1,uVar3);
    CTestResource::VerifyResourceSize<true>
              (&this->super_CTestResource,pGVar1,
               (ulong)((uVar2 & 0xfffffffc) * uVar3 + 0xfff & 0xfffff000));
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar1);
    lVar4 = lVar4 + 4;
  } while ((int)lVar4 != 0x14);
  return;
}

Assistant:

TEST_F(CTestResource, Test2DLinearResource)
{
    const uint32_t HAlign = 16;
    const uint32_t VAlign = 4;

    GMM_RESCREATE_PARAMS gmmParams = {};
    gmmParams.Type                 = RESOURCE_2D;
    gmmParams.NoGfxMemory          = 1;
    gmmParams.Flags.Info.Linear    = 1;
    gmmParams.Flags.Gpu.Texture    = 1;

    //Allocate 1x1 surface
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = 0x1;
        gmmParams.BaseHeight  = 0x1;

        const uint32_t MinPitch       = 32;
        const uint32_t PitchAlignment = 64;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        const uint32_t AlignedWidth  = GMM_ULT_ALIGN(gmmParams.BaseWidth64, HAlign);
        const uint32_t AlignedHeight = GMM_ULT_ALIGN(gmmParams.BaseHeight, VAlign);
        uint32_t       PitchInBytes  = AlignedWidth * GetBppValue(bpp);
        PitchInBytes                 = GMM_ULT_MAX(PitchInBytes, MinPitch);
        PitchInBytes                 = GMM_ULT_ALIGN(PitchInBytes, PitchAlignment);
        const uint32_t AlignedSize   = GMM_ULT_ALIGN(PitchInBytes * AlignedHeight, PAGE_SIZE);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign);
        VerifyResourcePitch<true>(ResourceInfo, PitchInBytes);
        VerifyResourceSize<true>(ResourceInfo, AlignedSize);

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }

    // Allocate 256 x 256
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = 256;
        gmmParams.BaseHeight  = 256;

        const uint32_t MinPitch       = 32;
        const uint32_t PitchAlignment = 64;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        const uint32_t AlignedWidth  = GMM_ULT_ALIGN(gmmParams.BaseWidth64, HAlign);
        const uint32_t AlignedHeight = GMM_ULT_ALIGN(gmmParams.BaseHeight, VAlign);
        uint32_t       PitchInBytes  = AlignedWidth * GetBppValue(bpp);
        PitchInBytes                 = GMM_ULT_MAX(PitchInBytes, MinPitch);
        PitchInBytes                 = GMM_ULT_ALIGN(PitchInBytes, PitchAlignment);
        const uint32_t AlignedSize   = GMM_ULT_ALIGN(PitchInBytes * AlignedHeight, PAGE_SIZE);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign);
        VerifyResourcePitch<true>(ResourceInfo, PitchInBytes);
        VerifyResourceSize<true>(ResourceInfo, AlignedSize);

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}